

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(text *arg)

{
  string *in_RSI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_type pos;
  undefined5 in_stack_fffffffffffffe20;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  string local_1d8 [32];
  string local_1b8 [38];
  byte local_192;
  byte local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string local_170 [97];
  byte local_10f;
  byte local_10e;
  byte local_10d;
  string local_100 [32];
  string local_e0 [39];
  byte local_b9;
  string local_b8 [160];
  long local_18;
  
  local_18 = std::__cxx11::string::rfind((char)in_RSI,0x3d);
  local_b9 = 0;
  local_10d = 0;
  local_10e = 0;
  local_10f = 0;
  local_191 = 0;
  local_192 = 0;
  bVar3 = 0;
  bVar2 = 0;
  bVar1 = 0;
  if (local_18 == -1) {
    std::__cxx11::string::string(local_b8,in_RSI);
    local_b9 = 1;
    std::__cxx11::string::string(local_100);
    local_10d = 1;
    std::__cxx11::string::string(local_e0,local_100);
    local_10e = 1;
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    local_10f = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(bVar1,in_stack_fffffffffffffe20))),in_RDI);
  }
  else {
    std::__cxx11::string::substr((ulong)&stack0xfffffffffffffe70,(ulong)in_RSI);
    local_191 = 1;
    std::__cxx11::string::string(local_170,(string *)&stack0xfffffffffffffe70);
    local_192 = 1;
    std::__cxx11::string::substr((ulong)local_1d8,(ulong)in_RSI);
    bVar3 = 1;
    std::__cxx11::string::string(local_1b8,local_1d8);
    bVar2 = 1;
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    bVar1 = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(1,in_stack_fffffffffffffe20))),in_RDI);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(bVar1,in_stack_fffffffffffffe20))),in_RDI);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(bVar1,in_stack_fffffffffffffe20))));
  if ((bVar1 & 1) != 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(bVar1,in_stack_fffffffffffffe20))));
  }
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::~string(local_1b8);
  }
  if ((bVar3 & 1) != 0) {
    std::__cxx11::string::~string(local_1d8);
  }
  if ((local_192 & 1) != 0) {
    std::__cxx11::string::~string(local_170);
  }
  if ((local_191 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
  }
  if ((local_10f & 1) != 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(bVar1,in_stack_fffffffffffffe20))));
  }
  if ((local_10e & 1) != 0) {
    std::__cxx11::string::~string(local_e0);
  }
  if ((local_10d & 1) != 0) {
    std::__cxx11::string::~string(local_100);
  }
  if ((local_b9 & 1) != 0) {
    std::__cxx11::string::~string(local_b8);
  }
  return in_RDI;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}